

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::GetSseSum8x8QuadTest_RefMseSum_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::GetSseSum8x8QuadTest_RefMseSum_Test>
           *this)

{
  MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
  *this_00;
  
  WithParamInterface<(anonymous_namespace)::TestParams<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*,int*,unsigned_int*,int*,unsigned_int*)>>
  ::parameter_ = &this->parameter_;
  this_00 = (MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
             *)operator_new(0x60);
  anon_unknown.dwarf_1d6630d::
  MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
  ::MainTestClass(this_00);
  (this_00->
  super_TestWithParam<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f677f0;
  (this_00->
  super_TestWithParam<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>
  ).
  super_WithParamInterface<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__GetSseSum8x8QuadTest_RefMseSum_Test_00f67830;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }